

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::MergeFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  undefined1 auStack_38 [8];
  UnknownFieldSet other;
  
  auStack_38 = (undefined1  [8])0x0;
  other.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  other.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = internal::WireFormat::SkipMessage(input,(UnknownFieldSet *)auStack_38);
  if ((bVar1) && (input->legitimate_message_end_ == true)) {
    bVar1 = true;
    MergeFromAndDestroy(this,(UnknownFieldSet *)auStack_38);
  }
  else {
    bVar1 = false;
  }
  if (auStack_38 !=
      (undefined1  [8])
      other.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ClearFallback((UnknownFieldSet *)auStack_38);
  }
  if (auStack_38 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_38);
  }
  return bVar1;
}

Assistant:

bool UnknownFieldSet::MergeFromCodedStream(io::CodedInputStream* input) {
  UnknownFieldSet other;
  if (internal::WireFormat::SkipMessage(input, &other) &&
      input->ConsumedEntireMessage()) {
    MergeFromAndDestroy(&other);
    return true;
  } else {
    return false;
  }
}